

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_builtin_primitive_outputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  char *pcVar1;
  uint *puVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  SmallVector<unsigned_int,_8UL> bits;
  SmallVector<unsigned_int,_8UL> local_60;
  
  uVar5 = 0;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar5 & 0x3f) &
        1) != 0) {
      emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(uint32_t)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x40);
  count = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_60.super_VectorView<unsigned_int>.buffer_size = 0;
    local_60.buffer_capacity = 8;
    local_60.super_VectorView<unsigned_int>.ptr = (uint *)&local_60.stack_storage;
    SmallVector<unsigned_int,_8UL>::reserve(&local_60,count);
    p_Var3 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
             _M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_60,local_60.super_VectorView<unsigned_int>.buffer_size + 1);
        *(undefined4 *)
         ((char *)local_60.super_VectorView<unsigned_int>.ptr +
         local_60.super_VectorView<unsigned_int>.buffer_size * 4) = *(undefined4 *)&p_Var3[1]._M_nxt
        ;
        local_60.super_VectorView<unsigned_int>.buffer_size =
             local_60.super_VectorView<unsigned_int>.buffer_size + 1;
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    puVar2 = local_60.super_VectorView<unsigned_int>.ptr;
    if (local_60.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar6 = local_60.super_VectorView<unsigned_int>.buffer_size * 4;
      pcVar1 = (char *)local_60.super_VectorView<unsigned_int>.ptr;
      lVar4 = 0x3f;
      if (local_60.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_60.super_VectorView<unsigned_int>.buffer_size >> lVar4 == 0; lVar4 = lVar4 + -1
            ) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_60.super_VectorView<unsigned_int>.ptr,pcVar1 + lVar6,
                 ((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar2,pcVar1 + lVar6);
      puVar2 = local_60.super_VectorView<unsigned_int>.ptr;
      if (local_60.super_VectorView<unsigned_int>.buffer_size != 0) {
        lVar6 = local_60.super_VectorView<unsigned_int>.buffer_size << 2;
        lVar4 = 0;
        do {
          emit_builtin_primitive_outputs_in_struct::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)this,*(uint32_t *)((char *)puVar2 + lVar4));
          lVar4 = lVar4 + 4;
        } while (lVar6 != lVar4);
      }
    }
    local_60.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_60.super_VectorView<unsigned_int>.ptr !=
        &local_60.stack_storage) {
      free(local_60.super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_primitive_outputs_in_struct()
{
	active_output_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInLayer:
		{
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Render target array index output is only supported in SM 5.0 or higher.");
			type = "uint";
			semantic = "SV_RenderTargetArrayIndex";
			break;
		}

		case BuiltInPrimitiveId:
			type = "uint";
			semantic = "SV_PrimitiveID";
			break;

		case BuiltInViewportIndex:
			type = "uint";
			semantic = "SV_ViewportArrayIndex";
			break;

		case BuiltInPrimitiveShadingRateKHR:
			type = "uint";
			semantic = "SV_ShadingRate";
			break;

		case BuiltInCullPrimitiveEXT:
			type = "bool";
			semantic = "SV_CullPrimitive";
			break;

		default:
			break;
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassOutput), " : ", semantic, ";");
	});
}